

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

iterator __thiscall
google::protobuf::RepeatedField<double>::erase
          (RepeatedField<double> *this,const_iterator first,const_iterator last)

{
  const_iterator pdVar1;
  const_iterator __result;
  iterator pdVar2;
  long in_RDX;
  long in_RSI;
  double *in_RDI;
  int in_stack_0000001c;
  RepeatedField<double> *in_stack_00000020;
  size_type first_offset;
  RepeatedField<double> *in_stack_ffffffffffffffc0;
  double *in_stack_ffffffffffffffc8;
  
  pdVar1 = cbegin((RepeatedField<double> *)0x43588c);
  if (in_RSI != in_RDX) {
    __result = cend(in_stack_ffffffffffffffc0);
    begin((RepeatedField<double> *)0x4358cd);
    std::copy<double_const*,double*>(in_RDI,in_stack_ffffffffffffffc8,__result);
    cbegin((RepeatedField<double> *)0x4358f9);
    Truncate(in_stack_00000020,in_stack_0000001c);
  }
  pdVar2 = begin((RepeatedField<double> *)0x43591e);
  return pdVar2 + (int)(in_RSI - (long)pdVar1 >> 3);
}

Assistant:

inline typename RepeatedField<Element>::iterator RepeatedField<Element>::erase(
    const_iterator first, const_iterator last) {
  size_type first_offset = first - cbegin();
  if (first != last) {
    Truncate(std::copy(last, cend(), begin() + first_offset) - cbegin());
  }
  return begin() + first_offset;
}